

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
          (void *param_1,array_storage *param_2)

{
  array_storage *paVar1;
  bool_storage *this;
  array_storage temp;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  array_storage local_28;
  array_storage *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  paVar1 = cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                     (in_stack_ffffffffffffffc0);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::array_storage::array_storage
            (&local_28,paVar1);
  paVar1 = local_18;
  this = cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage&>
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (bool_storage *)paVar1);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage&>
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,paVar1);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }